

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O3

bool __thiscall ImGuiWS::setDrawData(ImGuiWS *this,ImDrawData *drawData)

{
  _Head_base<0UL,_ImGuiWS::Impl_*,_false> _Var1;
  pointer pvVar2;
  undefined1 uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  unique_lock<std::shared_mutex> lock;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_58;
  unique_lock<std::shared_mutex> local_40;
  
  uVar3 = (**(code **)(*(long *)(((this->m_impl)._M_t.
                                  super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                  .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                compressorDrawData)._M_t + 0x10))();
  puVar4 = (undefined8 *)
           (**(code **)(*(long *)(((this->m_impl)._M_t.
                                   super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                   .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                 compressorDrawData)._M_t + 0x18))();
  puVar5 = (undefined8 *)
           (**(code **)(*(long *)(((this->m_impl)._M_t.
                                   super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>
                                   .super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->
                                 compressorDrawData)._M_t + 0x20))();
  local_40._M_device =
       &((this->m_impl)._M_t.
         super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>._M_t.
         super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
         super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl)->mutex;
  local_40._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&local_40);
  local_40._M_owns = true;
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  local_58.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       *(pointer *)((long)&(_Var1._M_head_impl)->dataRead + 0x70);
  pvVar2 = (pointer)puVar4[1];
  local_58.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        &((DrawLists *)((long)&(_Var1._M_head_impl)->dataRead + 0x60))->
         super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ;
  local_58.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       *(pointer *)((long)&(_Var1._M_head_impl)->dataRead + 0x68);
  *(undefined8 *)
   &((DrawLists *)((long)&(_Var1._M_head_impl)->dataRead + 0x60))->
    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
       = *puVar4;
  *(pointer *)((long)&(_Var1._M_head_impl)->dataRead + 0x68) = pvVar2;
  *(pointer *)((long)&(_Var1._M_head_impl)->dataRead + 0x70) = (pointer)puVar4[2];
  puVar4[2] = 0;
  *puVar4 = 0;
  puVar4[1] = 0;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  _Var1._M_head_impl =
       (this->m_impl)._M_t.super___uniq_ptr_impl<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>
       ._M_t.super__Tuple_impl<0UL,_ImGuiWS::Impl_*,_std::default_delete<ImGuiWS::Impl>_>.
       super__Head_base<0UL,_ImGuiWS::Impl_*,_false>._M_head_impl;
  local_58.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       *(pointer *)((long)&(_Var1._M_head_impl)->dataRead + 0x88);
  pvVar2 = (pointer)puVar5[1];
  local_58.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        &((DrawListsDiff *)((long)&(_Var1._M_head_impl)->dataRead + 0x78))->
         super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ;
  local_58.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       *(pointer *)((long)&(_Var1._M_head_impl)->dataRead + 0x80);
  *(undefined8 *)
   &((DrawListsDiff *)((long)&(_Var1._M_head_impl)->dataRead + 0x78))->
    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
       = *puVar5;
  *(pointer *)((long)&(_Var1._M_head_impl)->dataRead + 0x80) = pvVar2;
  *(pointer *)((long)&(_Var1._M_head_impl)->dataRead + 0x88) = (pointer)puVar5[2];
  puVar5[2] = 0;
  *puVar5 = 0;
  puVar5[1] = 0;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_40);
  return (bool)uVar3;
}

Assistant:

bool ImGuiWS::setDrawData(const ImDrawData * drawData) {
    bool result = true;

    result &= m_impl->compressorDrawData->setDrawData(drawData);

    auto & drawLists = m_impl->compressorDrawData->getDrawLists();
    auto & drawListsDiff = m_impl->compressorDrawData->getDrawListsDiff();

    // make the draw lists available to incppect clients
    {
        std::unique_lock lock(m_impl->mutex);

        m_impl->dataRead.drawLists = std::move(drawLists);
        m_impl->dataRead.drawListsDiff = std::move(drawListsDiff);
    }

    return result;
}